

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int InitRGBRescaler(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  int iVar2;
  WebPRescaler *rescaler;
  long lVar3;
  long lVar4;
  uint64_t size;
  void *pvVar5;
  uint8_t *dst;
  ulong uVar6;
  undefined8 *in_RSI;
  rescaler_t *in_RDI;
  int num_rescalers;
  WebPRescaler *scalers;
  size_t rescaler_size;
  uint64_t total_size;
  uint64_t tmp_size2;
  uint64_t tmp_size1;
  uint8_t *tmp;
  rescaler_t *work;
  size_t work_size;
  int uv_in_height;
  int uv_in_width;
  int out_height;
  int out_width;
  int has_alpha;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint64_t in_stack_ffffffffffffff78;
  long local_80;
  long lVar7;
  rescaler_t dst_stride;
  
  iVar1 = WebPIsAlphaMode(MODE_RGB);
  dst_stride = in_RDI[0x23];
  rescaler = (WebPRescaler *)((long)(int)dst_stride * 2);
  iVar2 = 3;
  if (iVar1 != 0) {
    iVar2 = 4;
  }
  lVar3 = (long)iVar2 * (long)rescaler;
  lVar4 = (long)iVar2 * 0x68 + 0x1f;
  size = lVar4 + lVar3 * 4 + (long)iVar2 * (long)(int)dst_stride;
  iVar2 = CheckSizeOverflow(size);
  if (iVar2 != 0) {
    pvVar5 = WebPSafeMalloc(in_stack_ffffffffffffff78,
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_RSI[10] = pvVar5;
    if (in_RSI[10] != 0) {
      lVar7 = in_RSI[10];
      dst = (uint8_t *)(lVar7 + lVar3 * 4);
      uVar6 = ((lVar7 + size) - lVar4) + 0x1f & 0xffffffffffffffe0;
      in_RSI[6] = uVar6;
      in_RSI[7] = uVar6 + 0x68;
      in_RSI[8] = uVar6 + 0xd0;
      if (iVar1 == 0) {
        local_80 = 0;
      }
      else {
        local_80 = uVar6 + 0x138;
      }
      in_RSI[9] = local_80;
      iVar2 = WebPRescalerInit(rescaler,(int)((ulong)lVar7 >> 0x20),(int)lVar7,dst,
                               (int)((ulong)lVar3 >> 0x20),(int)lVar3,dst_stride,(int)in_RSI,in_RDI)
      ;
      if (((iVar2 != 0) &&
          (iVar2 = WebPRescalerInit(rescaler,(int)((ulong)lVar7 >> 0x20),(int)lVar7,dst,
                                    (int)((ulong)lVar3 >> 0x20),(int)lVar3,dst_stride,(int)in_RSI,
                                    in_RDI), iVar2 != 0)) &&
         (iVar2 = WebPRescalerInit(rescaler,(int)((ulong)lVar7 >> 0x20),(int)lVar7,dst,
                                   (int)((ulong)lVar3 >> 0x20),(int)lVar3,dst_stride,(int)in_RSI,
                                   in_RDI), iVar2 != 0)) {
        in_RSI[0xb] = EmitRescaledRGB;
        WebPInitYUV444Converters();
        if (iVar1 != 0) {
          iVar1 = WebPRescalerInit(rescaler,(int)((ulong)lVar7 >> 0x20),(int)lVar7,dst,
                                   (int)((ulong)lVar3 >> 0x20),(int)lVar3,dst_stride,(int)in_RSI,
                                   in_RDI);
          if (iVar1 == 0) {
            return 0;
          }
          in_RSI[0xc] = EmitRescaledAlphaRGB;
          if ((*(int *)*in_RSI == 5) || (*(int *)*in_RSI == 10)) {
            in_RSI[0xd] = ExportAlphaRGBA4444;
          }
          else {
            in_RSI[0xd] = ExportAlpha;
          }
          WebPInitAlphaProcessing();
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int InitRGBRescaler(const VP8Io* const io, WebPDecParams* const p) {
  const int has_alpha = WebPIsAlphaMode(p->output->colorspace);
  const int out_width  = io->scaled_width;
  const int out_height = io->scaled_height;
  const int uv_in_width  = (io->mb_w + 1) >> 1;
  const int uv_in_height = (io->mb_h + 1) >> 1;
  // scratch memory for one rescaler
  const size_t work_size = 2 * (size_t)out_width;
  rescaler_t* work;  // rescalers work area
  uint8_t* tmp;   // tmp storage for scaled YUV444 samples before RGB conversion
  uint64_t tmp_size1, tmp_size2, total_size;
  size_t rescaler_size;
  WebPRescaler* scalers;
  const int num_rescalers = has_alpha ? 4 : 3;

  tmp_size1 = (uint64_t)num_rescalers * work_size;
  tmp_size2 = (uint64_t)num_rescalers * out_width;
  total_size = tmp_size1 * sizeof(*work) + tmp_size2 * sizeof(*tmp);
  rescaler_size = num_rescalers * sizeof(*p->scaler_y) + WEBP_ALIGN_CST;
  total_size += rescaler_size;
  if (!CheckSizeOverflow(total_size)) {
    return 0;
  }

  p->memory = WebPSafeMalloc(1ULL, (size_t)total_size);
  if (p->memory == NULL) {
    return 0;   // memory error
  }
  work = (rescaler_t*)p->memory;
  tmp = (uint8_t*)(work + tmp_size1);

  scalers = (WebPRescaler*)WEBP_ALIGN(
      (const uint8_t*)work + total_size - rescaler_size);
  p->scaler_y = &scalers[0];
  p->scaler_u = &scalers[1];
  p->scaler_v = &scalers[2];
  p->scaler_a = has_alpha ? &scalers[3] : NULL;

  if (!WebPRescalerInit(p->scaler_y, io->mb_w, io->mb_h,
                        tmp + 0 * out_width, out_width, out_height, 0, 1,
                        work + 0 * work_size) ||
      !WebPRescalerInit(p->scaler_u, uv_in_width, uv_in_height,
                        tmp + 1 * out_width, out_width, out_height, 0, 1,
                        work + 1 * work_size) ||
      !WebPRescalerInit(p->scaler_v, uv_in_width, uv_in_height,
                        tmp + 2 * out_width, out_width, out_height, 0, 1,
                        work + 2 * work_size)) {
    return 0;
  }
  p->emit = EmitRescaledRGB;
  WebPInitYUV444Converters();

  if (has_alpha) {
    if (!WebPRescalerInit(p->scaler_a, io->mb_w, io->mb_h,
                          tmp + 3 * out_width, out_width, out_height, 0, 1,
                          work + 3 * work_size)) {
      return 0;
    }
    p->emit_alpha = EmitRescaledAlphaRGB;
    if (p->output->colorspace == MODE_RGBA_4444 ||
        p->output->colorspace == MODE_rgbA_4444) {
      p->emit_alpha_row = ExportAlphaRGBA4444;
    } else {
      p->emit_alpha_row = ExportAlpha;
    }
    WebPInitAlphaProcessing();
  }
  return 1;
}